

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int arena_i_extent_hooks_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  uint ind;
  uint uVar1;
  ehooks_t *ehooks;
  undefined8 *in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  ulong *in_R8;
  long in_R9;
  long in_stack_00000008;
  size_t copylen_2;
  size_t copylen_1;
  extent_hooks_t *new_extent_hooks_1;
  arena_config_t config;
  extent_hooks_t *new_extent_hooks;
  size_t copylen;
  extent_hooks_t *old_extent_hooks;
  arena_t *arena;
  uint arena_ind;
  int ret;
  arena_config_t *in_stack_ffffffffffffff40;
  ulong __n;
  extent_hooks_t *in_stack_ffffffffffffff48;
  extent_hooks_t *__n_00;
  arena_t *in_stack_ffffffffffffff50;
  arena_t *__n_01;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  tsdn_t *in_stack_ffffffffffffff60;
  extent_hooks_t *local_68;
  arena_t *local_60;
  uint local_58;
  int local_54;
  long local_50;
  ulong *local_48;
  undefined8 *local_40;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                    (malloc_mutex_t *)in_stack_ffffffffffffff50);
  if (*(ulong *)(local_30 + 8) < 0x100000000) {
    ind = (uint)*(undefined8 *)(local_30 + 8);
    local_58 = ind;
    uVar1 = duckdb_je_narenas_total_get();
    if (ind < uVar1) {
      local_10 = local_28;
      local_60 = arena_get(in_stack_ffffffffffffff60,ind,
                           SUB41((uint)in_stack_ffffffffffffff58 >> 0x18,0));
      if (local_60 == (arena_t *)0x0) {
        if (duckdb_je_narenas_auto <= local_58) {
          local_54 = 0xe;
          goto LAB_024dcbd3;
        }
        local_68 = &duckdb_je_ehooks_default_extent_hooks;
        if ((local_40 != (undefined8 *)0x0) && (local_48 != (ulong *)0x0)) {
          if (*local_48 != 8) {
            if (*local_48 < 8) {
              __n_01 = (arena_t *)*local_48;
            }
            else {
              __n_01 = (arena_t *)0x8;
            }
            in_stack_ffffffffffffff50 = __n_01;
            memcpy(local_40,&local_68,(size_t)__n_01);
            *local_48 = (ulong)__n_01;
            local_54 = 0x16;
            goto LAB_024dcbd3;
          }
          *local_40 = &duckdb_je_ehooks_default_extent_hooks;
        }
        if (local_50 != 0) {
          if ((local_50 != 0) && (in_stack_00000008 != 8)) {
            local_54 = 0x16;
            goto LAB_024dcbd3;
          }
          local_18 = local_28;
          local_60 = duckdb_je_arena_init
                               ((tsdn_t *)in_stack_ffffffffffffff50,
                                (uint)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                                in_stack_ffffffffffffff40);
          if (local_60 == (arena_t *)0x0) {
            local_54 = 0xe;
            goto LAB_024dcbd3;
          }
        }
      }
      else if (local_50 == 0) {
        ehooks = duckdb_je_arena_get_ehooks((arena_t *)0x24dcb07);
        local_68 = ehooks_get_extent_hooks_ptr(ehooks);
        if ((local_40 != (undefined8 *)0x0) && (local_48 != (ulong *)0x0)) {
          if (*local_48 != 8) {
            if (*local_48 < 8) {
              __n = *local_48;
            }
            else {
              __n = 8;
            }
            memcpy(local_40,&local_68,__n);
            *local_48 = __n;
            local_54 = 0x16;
            goto LAB_024dcbd3;
          }
          *local_40 = local_68;
        }
      }
      else {
        if ((local_50 != 0) && (in_stack_00000008 != 8)) {
          local_54 = 0x16;
          goto LAB_024dcbd3;
        }
        local_68 = duckdb_je_arena_set_extent_hooks
                             ((tsd_t *)CONCAT44(ind,in_stack_ffffffffffffff58),
                              in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if ((local_40 != (undefined8 *)0x0) && (local_48 != (ulong *)0x0)) {
          if (*local_48 != 8) {
            if (*local_48 < 8) {
              __n_00 = (extent_hooks_t *)*local_48;
            }
            else {
              __n_00 = (extent_hooks_t *)0x8;
            }
            in_stack_ffffffffffffff48 = __n_00;
            memcpy(local_40,&local_68,(size_t)__n_00);
            *local_48 = (ulong)__n_00;
            local_54 = 0x16;
            goto LAB_024dcbd3;
          }
          *local_40 = local_68;
        }
      }
      local_54 = 0;
    }
    else {
      local_54 = 0xe;
    }
  }
  else {
    local_54 = 0xe;
  }
LAB_024dcbd3:
  local_20 = local_28;
  malloc_mutex_unlock((tsdn_t *)in_stack_ffffffffffffff50,
                      (malloc_mutex_t *)in_stack_ffffffffffffff48);
  return local_54;
}

Assistant:

static int
arena_i_extent_hooks_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	MIB_UNSIGNED(arena_ind, 1);
	if (arena_ind < narenas_total_get()) {
		extent_hooks_t *old_extent_hooks;
		arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
		if (arena == NULL) {
			if (arena_ind >= narenas_auto) {
				ret = EFAULT;
				goto label_return;
			}
			old_extent_hooks =
			    (extent_hooks_t *)&ehooks_default_extent_hooks;
			READ(old_extent_hooks, extent_hooks_t *);
			if (newp != NULL) {
				/* Initialize a new arena as a side effect. */
				extent_hooks_t *new_extent_hooks
				    JEMALLOC_CC_SILENCE_INIT(NULL);
				WRITE(new_extent_hooks, extent_hooks_t *);
				arena_config_t config = arena_config_default;
				config.extent_hooks = new_extent_hooks;

				arena = arena_init(tsd_tsdn(tsd), arena_ind,
				    &config);
				if (arena == NULL) {
					ret = EFAULT;
					goto label_return;
				}
			}
		} else {
			if (newp != NULL) {
				extent_hooks_t *new_extent_hooks
				    JEMALLOC_CC_SILENCE_INIT(NULL);
				WRITE(new_extent_hooks, extent_hooks_t *);
				old_extent_hooks = arena_set_extent_hooks(tsd,
				    arena, new_extent_hooks);
				READ(old_extent_hooks, extent_hooks_t *);
			} else {
				old_extent_hooks =
				    ehooks_get_extent_hooks_ptr(
					arena_get_ehooks(arena));
				READ(old_extent_hooks, extent_hooks_t *);
			}
		}
	} else {
		ret = EFAULT;
		goto label_return;
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}